

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesBodySharedMass.cpp
# Opt level: O3

void __thiscall chrono::ChSharedMassBody::ArchiveOUT(ChSharedMassBody *this,ChArchiveOut *marchive)

{
  ChArchiveOut::VersionWrite<chrono::ChSharedMassBody>(marchive);
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive);
  return;
}

Assistant:

void ChSharedMassBody::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChSharedMassBody>();

    // serialize all member data:
    marchive << CHNVP(mass);
    ////marchive << CHNVP(inertia);
}